

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::
to_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
          (string *__return_storage_ptr__,lest *this,
          unexpected_type<std::__exception_ptr::exception_ptr> *lhs,string *op,
          unexpected_type<std::__exception_ptr::exception_ptr> *rhs)

{
  ostream *poVar1;
  unexpected_type<std::__exception_ptr::exception_ptr> *item;
  unexpected_type<std::__exception_ptr::exception_ptr> *item_00;
  ostringstream os;
  ForNonEnum<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,_std::string>
  FStack_1d8;
  ForNonEnum<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>,_std::string>
  local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  make_enum_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
            (&local_1b8,this,item);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  make_enum_string<nonstd::expected_lite::unexpected_type<std::__exception_ptr::exception_ptr>>
            (&FStack_1d8,(lest *)op,item_00);
  std::operator<<(poVar1,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}